

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGParseManager.cpp
# Opt level: O0

HRESULT __thiscall
BGParseWorkItem::DeserializeParseResults
          (BGParseWorkItem *this,ScriptContext *scriptContextUI,LPCUTF8 pszSrc,SRCINFO *pSrcInfo,
          Utf8SourceInfo *utf8SourceInfo,FunctionBody **functionBodyReturn,size_t *srcLength,
          uint *sourceIndex)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  FunctionBody **ppFVar5;
  nullptr_t local_50;
  WriteBarrierPtr<Js::FunctionBody> local_48;
  Type functionBody;
  HRESULT hr;
  FunctionBody **functionBodyReturn_local;
  Utf8SourceInfo *utf8SourceInfo_local;
  SRCINFO *pSrcInfo_local;
  LPCUTF8 pszSrc_local;
  ScriptContext *scriptContextUI_local;
  BGParseWorkItem *this_local;
  
  functionBody.ptr._4_4_ = this->parseHR;
  if (functionBody.ptr._4_4_ == 0) {
    functionBodyReturn_local = (FunctionBody **)utf8SourceInfo;
    utf8SourceInfo_local = (Utf8SourceInfo *)pSrcInfo;
    pSrcInfo_local = (SRCINFO *)pszSrc;
    pszSrc_local = (LPCUTF8)scriptContextUI;
    scriptContextUI_local = (ScriptContext *)this;
    if (utf8SourceInfo == (Utf8SourceInfo *)0x0) {
      Js::ScriptContext::MakeUtf8SourceInfo
                (scriptContextUI,this->script,this->cb,pSrcInfo,
                 (Utf8SourceInfo **)&functionBodyReturn_local,LoadScriptFlag_Utf8Source,(Var)0x0);
    }
    *srcLength = this->parseSourceLength;
    uVar3 = Js::ScriptContext::SaveSourceNoCopy
                      ((ScriptContext *)pszSrc_local,(Utf8SourceInfo *)functionBodyReturn_local,
                       (int)*srcLength,false);
    *sourceIndex = uVar3;
    if (*sourceIndex == 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/BGParseManager.cpp"
                         ,0x25b,"(sourceIndex != Js::Constants::InvalidSourceIndex)",
                         "sourceIndex != Js::Constants::InvalidSourceIndex");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    local_50 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<Js::FunctionBody>::WriteBarrierPtr(&local_48,&local_50);
    functionBody.ptr._4_4_ =
         Js::ByteCodeSerializer::DeserializeFromBuffer
                   ((ScriptContext *)pszSrc_local,0x1118,(LPCUTF8)pSrcInfo_local,
                    (SRCINFO *)utf8SourceInfo_local,this->bufferReturn,(NativeModule *)0x0,&local_48
                    ,*sourceIndex);
    if (functionBody.ptr._4_4_ == 0) {
      ppFVar5 = Memory::WriteBarrierPtr::operator_cast_to_FunctionBody__
                          ((WriteBarrierPtr *)&local_48);
      *functionBodyReturn = *ppFVar5;
      this->bufferReturn = (byte *)0x0;
      this->bufferReturnBytes = 0;
    }
  }
  return functionBody.ptr._4_4_;
}

Assistant:

HRESULT BGParseWorkItem::DeserializeParseResults(
    Js::ScriptContext* scriptContextUI,
    LPCUTF8 pszSrc,
    SRCINFO const * pSrcInfo,
    Js::Utf8SourceInfo* utf8SourceInfo,
    Js::FunctionBody** functionBodyReturn,
    size_t& srcLength,
    uint& sourceIndex
)
{
    HRESULT hr = this->parseHR;
    if (hr == S_OK)
    {
        if (utf8SourceInfo == nullptr)
        {
            scriptContextUI->MakeUtf8SourceInfo(
                this->script,
                this->cb,
                pSrcInfo,
                &utf8SourceInfo,
                LoadScriptFlag_Utf8Source,
                nullptr // Var scriptSource
            );
        }

        srcLength = this->parseSourceLength;
        sourceIndex = scriptContextUI->SaveSourceNoCopy(utf8SourceInfo, (int)srcLength, false /*isCesu8*/);
        Assert(sourceIndex != Js::Constants::InvalidSourceIndex);

        Field(Js::FunctionBody*) functionBody = nullptr;
        hr = Js::ByteCodeSerializer::DeserializeFromBuffer(
            scriptContextUI,
            BGPARSE_FLAGS,
            (const byte *)pszSrc,
            pSrcInfo,
            this->bufferReturn,
            nullptr, // nativeModule
            &functionBody,
            sourceIndex
        );

        if (hr == S_OK)
        {
            // The buffer is now owned by the output of DeserializeFromBuffer
            (*functionBodyReturn) = functionBody;
            this->bufferReturn = nullptr;
            this->bufferReturnBytes = 0;
        }
    }

    return hr;
}